

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcShapeModel::~IfcShapeModel(IfcShapeModel *this)

{
  ~IfcShapeModel((IfcShapeModel *)&this[-1].super_IfcRepresentation.field_0x28);
  return;
}

Assistant:

IfcShapeModel() : Object("IfcShapeModel") {}